

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmi_helper.c
# Opt level: O1

uint64_t helper_pmaddhw_mipsel(uint64_t fs,uint64_t ft)

{
  return CONCAT44((int)(short)(ft >> 0x20) * (int)(short)(fs >> 0x20) +
                  (int)(short)(ft >> 0x30) * (int)(short)(fs >> 0x30),
                  ((int)ft >> 0x10) * ((int)fs >> 0x10) + (int)(short)ft * (int)(short)fs);
}

Assistant:

uint64_t helper_pmaddhw(uint64_t fs, uint64_t ft)
{
    unsigned host = BYTE_ORDER_XOR(3);
    LMIValue vs, vt;
    uint32_t p0, p1;

    vs.d = fs;
    vt.d = ft;
    p0  = vs.sh[0 ^ host] * vt.sh[0 ^ host];
    p0 += vs.sh[1 ^ host] * vt.sh[1 ^ host];
    p1  = vs.sh[2 ^ host] * vt.sh[2 ^ host];
    p1 += vs.sh[3 ^ host] * vt.sh[3 ^ host];

    return ((uint64_t)p1 << 32) | p0;
}